

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int decode_server_hello(ptls_t *tls,st_ptls_server_hello_t *sh,uint8_t *src,uint8_t *end)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined2 uVar3;
  st_ptls_server_hello_t *psVar4;
  int iVar5;
  uint8_t *puVar6;
  ptls_cipher_suite_t *ppVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  ptls_iovec_t pVar10;
  uint8_t *local_128;
  size_t local_120;
  uint8_t *end_4;
  size_t _block_size_3;
  size_t _capacity_3;
  undefined1 auStack_f8 [6];
  uint16_t group;
  size_t local_f0;
  uint8_t *local_e8;
  uint8_t *end_3;
  size_t _block_size_2;
  size_t _capacity_2;
  uint8_t *end_2;
  size_t _block_size_1;
  size_t _capacity_1;
  st_ptls_extension_bitmap_t bitmap;
  uint16_t selected_psk_identity;
  uint16_t found_version;
  uint16_t exttype;
  uint16_t csid;
  size_t local_a0;
  uint8_t *end_1;
  size_t _block_size;
  size_t _capacity;
  uint local_2c;
  uint8_t *puStack_28;
  int ret;
  uint8_t *end_local;
  uint8_t *src_local;
  st_ptls_server_hello_t *sh_local;
  ptls_t *tls_local;
  
  puStack_28 = end;
  end_local = src;
  src_local = sh->random_;
  sh_local = (st_ptls_server_hello_t *)tls;
  memset(&_capacity,0,0x50);
  memcpy(sh,&_capacity,0x50);
  if ((long)puStack_28 - (long)end_local < 2) {
    local_2c = 0x32;
  }
  else {
    end_local = end_local + 2;
    if ((long)puStack_28 - (long)end_local < 0x20) {
      local_2c = 0x32;
    }
    else {
      iVar5 = memcmp(end_local,hello_retry_random,0x20);
      puVar9 = src_local;
      *(uint *)(src_local + 0x30) = (uint)(iVar5 == 0);
      _block_size = 1;
      if (puStack_28 == end_local + 0x20) {
        local_2c = 0x32;
      }
      else {
        end_1 = (uint8_t *)0x0;
        end_local = end_local + 0x20;
        do {
          puVar8 = end_local + 1;
          end_1 = (uint8_t *)((long)end_1 << 8 | (ulong)*end_local);
          _block_size = _block_size - 1;
          end_local = puVar8;
        } while (_block_size != 0);
        if (puStack_28 + -(long)puVar8 < end_1) {
          local_2c = 0x32;
        }
        else {
          puVar6 = puVar8 + (long)end_1;
          if ((long)puVar6 - (long)puVar8 < 0x21) {
            pVar10 = ptls_iovec_init(puVar8,(long)puVar6 - (long)puVar8);
            _selected_psk_identity = pVar10.base;
            *(uint8_t **)(puVar9 + 0x20) = _selected_psk_identity;
            local_a0 = pVar10.len;
            *(size_t *)(puVar9 + 0x28) = local_a0;
            end_local = puVar6;
            local_2c = ptls_decode16((uint16_t *)(bitmap.bits + 6),&end_local,puStack_28);
            if (local_2c == 0) {
              ppVar7 = find_cipher_suite(*(ptls_context_t **)sh_local->random_,bitmap.bits._6_2_);
              *(ptls_cipher_suite_t **)&sh_local[3].is_retry_request = ppVar7;
              if (ppVar7 == (ptls_cipher_suite_t *)0x0) {
                local_2c = 0x2f;
              }
              else if ((end_local == puStack_28) || (*end_local != '\0')) {
                local_2c = 0x2f;
              }
              else {
                if (*(int *)(src_local + 0x30) != 0) {
                  src_local[0x38] = 0xff;
                  src_local[0x39] = 0xff;
                }
                bitmap.bits[2] = 0xff;
                bitmap.bits[3] = 0xff;
                bitmap.bits[0] = 0xff;
                bitmap.bits[1] = 0xff;
                end_local = end_local + 1;
                init_extension_bitmap((st_ptls_extension_bitmap_t *)&_capacity_1,'\x02');
                _block_size_1 = 2;
                if ((ulong)((long)puStack_28 - (long)end_local) < 2) {
                  local_2c = 0x32;
                }
                else {
                  end_2 = (uint8_t *)0x0;
                  do {
                    puVar9 = end_local + 1;
                    end_2 = (uint8_t *)((long)end_2 << 8 | (ulong)*end_local);
                    _block_size_1 = _block_size_1 - 1;
                    end_local = puVar9;
                  } while (_block_size_1 != 0);
                  if (puStack_28 + -(long)puVar9 < end_2) {
                    local_2c = 0x32;
                  }
                  else {
                    _capacity_2 = (size_t)(puVar9 + (long)end_2);
                    _block_size_1 = 0;
                    do {
                      if (end_local == (uint8_t *)_capacity_2) {
                        if (end_local != (uint8_t *)_capacity_2) {
                          return 0x32;
                        }
                        if (end_local != puStack_28) {
                          return 0x32;
                        }
                        iVar5 = is_supported_version(bitmap.bits._2_2_);
                        if (iVar5 == 0) {
                          return 0x2f;
                        }
                        if (*(int *)(src_local + 0x30) == 0) {
                          if (bitmap.bits._0_2_ != -1) {
                            if ((sh_local[5].legacy_session_id.len & 1) == 0) {
                              return 0x2f;
                            }
                            if (bitmap.bits._0_2_ != 0) {
                              return 0x2f;
                            }
                            *(byte *)&sh_local[4].legacy_session_id.base =
                                 *(byte *)&sh_local[4].legacy_session_id.base & 0xfd | 2;
                          }
                          if ((*(long *)(src_local + 0x38) == 0) &&
                             ((*(byte *)&sh_local[4].legacy_session_id.base >> 1 & 1) == 0)) {
                            return 0x2f;
                          }
                        }
                        return 0;
                      }
                      local_2c = ptls_decode16((uint16_t *)(bitmap.bits + 4),&end_local,
                                               (uint8_t *)_capacity_2);
                      if (local_2c != 0) {
                        return local_2c;
                      }
                      iVar5 = extension_bitmap_is_set
                                        ((st_ptls_extension_bitmap_t *)&_capacity_1,
                                         bitmap.bits._4_2_);
                      if (iVar5 != 0) {
                        return 0x2f;
                      }
                      extension_bitmap_set
                                ((st_ptls_extension_bitmap_t *)&_capacity_1,bitmap.bits._4_2_);
                      psVar4 = sh_local;
                      uVar3 = bitmap.bits._4_2_;
                      _block_size_2 = 2;
                      if (_capacity_2 - (long)end_local < 2) {
                        return 0x32;
                      }
                      end_3 = (uint8_t *)0x0;
                      do {
                        puVar9 = end_local + 1;
                        end_3 = (uint8_t *)((long)end_3 << 8 | (ulong)*end_local);
                        _block_size_2 = _block_size_2 - 1;
                        end_local = puVar9;
                      } while (_block_size_2 != 0);
                      if ((uint8_t *)(_capacity_2 - (long)puVar9) < end_3) {
                        return 0x32;
                      }
                      local_e8 = puVar9 + (long)end_3;
                      if (*(long *)(*(long *)sh_local->random_ + 0xb8) != 0) {
                        pcVar1 = (code *)**(undefined8 **)(*(long *)sh_local->random_ + 0xb8);
                        uVar2 = *(undefined8 *)(*(long *)sh_local->random_ + 0xb8);
                        _auStack_f8 = ptls_iovec_init(puVar9,(long)local_e8 - (long)puVar9);
                        iVar5 = (*pcVar1)(uVar2,psVar4,2,uVar3,_auStack_f8,local_f0);
                        local_2c = (uint)(iVar5 != 0);
                        if (iVar5 != 0) {
                          return local_2c;
                        }
                      }
                      puVar9 = src_local;
                      switch(bitmap.bits._4_2_) {
                      case (BADTYPE)0x29:
                        if (*(int *)(src_local + 0x30) != 0) {
                          return 0x2f;
                        }
                        iVar5 = ptls_decode16((uint16_t *)&bitmap,&end_local,local_e8);
                        if (iVar5 != 0) {
                          return iVar5;
                        }
                        local_2c = 0;
                        break;
                      default:
                        end_local = local_e8;
                        break;
                      case (BADTYPE)0x2b:
                        iVar5 = ptls_decode16((uint16_t *)(bitmap.bits + 2),&end_local,local_e8);
                        if (iVar5 != 0) {
                          return iVar5;
                        }
                        local_2c = 0;
                        break;
                      case (BADTYPE)0x2c:
                        if (*(int *)(src_local + 0x30) == 0) {
                          return 0x2f;
                        }
                        _block_size_3 = 2;
                        if ((ulong)((long)local_e8 - (long)end_local) < 2) {
                          return 0x32;
                        }
                        end_4 = (uint8_t *)0x0;
                        do {
                          puVar8 = end_local + 1;
                          end_4 = (uint8_t *)((long)end_4 << 8 | (ulong)*end_local);
                          _block_size_3 = _block_size_3 - 1;
                          end_local = puVar8;
                        } while (_block_size_3 != 0);
                        if (local_e8 + -(long)puVar8 < end_4) {
                          return 0x32;
                        }
                        puVar6 = puVar8 + (long)end_4;
                        if (puVar8 == puVar6) {
                          return 0x32;
                        }
                        pVar10 = ptls_iovec_init(puVar8,(long)puVar6 - (long)puVar8);
                        local_128 = pVar10.base;
                        *(uint8_t **)(puVar9 + 0x40) = local_128;
                        local_120 = pVar10.len;
                        *(size_t *)(puVar9 + 0x48) = local_120;
                        end_local = puVar6;
                        if (puVar6 != local_e8) {
                          return 0x32;
                        }
                        break;
                      case (BADTYPE)0x33:
                        if (*(int *)(src_local + 0x30) == 0) {
                          iVar5 = decode_key_share_entry
                                            ((uint16_t *)((long)&_capacity_3 + 6),
                                             (ptls_iovec_t *)(src_local + 0x38),&end_local,local_e8)
                          ;
                          if (iVar5 != 0) {
                            return iVar5;
                          }
                          if (end_local != local_e8) {
                            return 0x32;
                          }
                          if ((sh_local[3].legacy_session_id.len == 0) ||
                             (*(short *)sh_local[3].legacy_session_id.len != _capacity_3._6_2_)) {
                            return 0x2f;
                          }
                        }
                        else {
                          iVar5 = ptls_decode16((uint16_t *)(src_local + 0x38),&end_local,local_e8);
                          if (iVar5 != 0) {
                            return iVar5;
                          }
                        }
                        local_2c = 0;
                      }
                    } while (end_local == local_e8);
                    local_2c = 0x32;
                  }
                }
              }
            }
          }
          else {
            local_2c = 0x32;
          }
        }
      }
    }
  }
  return local_2c;
}

Assistant:

static int decode_server_hello(ptls_t *tls, struct st_ptls_server_hello_t *sh, const uint8_t *src, const uint8_t *const end)
{
    int ret;

    *sh = (struct st_ptls_server_hello_t){{0}};

    /* ignore legacy-version */
    if (end - src < 2) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    src += 2;

    /* random */
    if (end - src < PTLS_HELLO_RANDOM_SIZE) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    sh->is_retry_request = memcmp(src, hello_retry_random, PTLS_HELLO_RANDOM_SIZE) == 0;
    src += PTLS_HELLO_RANDOM_SIZE;

    /* legacy_session_id */
    ptls_decode_open_block(src, end, 1, {
        if (end - src > 32) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        sh->legacy_session_id = ptls_iovec_init(src, end - src);
        src = end;
    });

    { /* select cipher_suite */
        uint16_t csid;
        if ((ret = ptls_decode16(&csid, &src, end)) != 0)
            goto Exit;
        if ((tls->cipher_suite = find_cipher_suite(tls->ctx, csid)) == NULL) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    }

    /* legacy_compression_method */
    if (src == end || *src++ != 0) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }

    if (sh->is_retry_request)
        sh->retry_request.selected_group = UINT16_MAX;

    uint16_t exttype, found_version = UINT16_MAX, selected_psk_identity = UINT16_MAX;
    decode_extensions(src, end, PTLS_HANDSHAKE_TYPE_SERVER_HELLO, &exttype, {
        if (tls->ctx->on_extension != NULL &&
            (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_SERVER_HELLO, exttype,
                                              ptls_iovec_init(src, end - src)) != 0))
            goto Exit;
        switch (exttype) {
        case PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS:
            if ((ret = ptls_decode16(&found_version, &src, end)) != 0)
                goto Exit;
            break;
        case PTLS_EXTENSION_TYPE_KEY_SHARE:
            if (sh->is_retry_request) {
                if ((ret = ptls_decode16(&sh->retry_request.selected_group, &src, end)) != 0)
                    goto Exit;
            } else {
                uint16_t group;
                if ((ret = decode_key_share_entry(&group, &sh->peerkey, &src, end)) != 0)
                    goto Exit;
                if (src != end) {
                    ret = PTLS_ALERT_DECODE_ERROR;
                    goto Exit;
                }
                if (tls->key_share == NULL || tls->key_share->id != group) {
                    ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                    goto Exit;
                }
            }
            break;
        case PTLS_EXTENSION_TYPE_COOKIE:
            if (sh->is_retry_request) {
                ptls_decode_block(src, end, 2, {
                    if (src == end) {
                        ret = PTLS_ALERT_DECODE_ERROR;
                        goto Exit;
                    }
                    sh->retry_request.cookie = ptls_iovec_init(src, end - src);
                    src = end;
                });
            } else {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            break;
        case PTLS_EXTENSION_TYPE_PRE_SHARED_KEY:
            if (sh->is_retry_request) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            } else {
                if ((ret = ptls_decode16(&selected_psk_identity, &src, end)) != 0)
                    goto Exit;
            }
            break;
        default:
            src = end;
            break;
        }
    });

    if (!is_supported_version(found_version)) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }
    if (!sh->is_retry_request) {
        if (selected_psk_identity != UINT16_MAX) {
            if (!tls->client.offered_psk) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            if (selected_psk_identity != 0) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            tls->is_psk_handshake = 1;
        }
        if (sh->peerkey.base == NULL && !tls->is_psk_handshake) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    }

    ret = 0;
Exit:
    return ret;
}